

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O1

uint ON_MeshNgon::FindPlanarNgons
               (ON_3dPointListRef *vertex_list,ON_MeshFaceList *face_list,uint **vertex_face_map,
               double planar_tolerance,uint minimum_ngon_vertex_count,uint minimum_ngon_face_count,
               bool bAllowHoles,ON_MeshNgonAllocator *NgonAllocator,
               ON_SimpleArray<unsigned_int> *NgonMap,ON_SimpleArray<ON_MeshNgon_*> *Ngons)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  float *pfVar5;
  ON_3dPoint P;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint P_02;
  uint uVar6;
  bool bVar7;
  uint *puVar8;
  ulong uVar9;
  double *pdVar10;
  NgonNeighbors *pNVar11;
  byte bVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  uint uVar18;
  ON_Plane *pOVar19;
  uint uVar20;
  long lVar21;
  undefined7 in_register_00000089;
  long lVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  ulong new_capacity;
  double dVar26;
  ON_SimpleArray<unsigned_int> ngon_fi;
  uint nbr_face_index;
  uint Fvi [4];
  ON_3dVector A;
  ON_SimpleArray<NgonNeighbors> ngon_nbr_map;
  ON_SimpleArray<unsigned_int> ngon_vi;
  ON_MeshNgon *ngon;
  uint Fvi_1 [4];
  ON_3dVector B;
  ON_PlaneEquation e;
  double buffer [4] [3];
  ON_MeshVertexFaceMap ws_vfmap;
  uint *local_2f8;
  uint local_2ec;
  uint *local_2e8;
  uint local_2b4;
  ON_SimpleArray<unsigned_int> local_2b0;
  double local_298;
  _func_int **local_290;
  double local_288;
  double local_280;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268 [8];
  undefined1 local_248 [16];
  _func_int **local_238;
  double dStack_230;
  ulong local_220;
  long local_218;
  long local_210;
  uint *local_208;
  ON_SimpleArray<NgonNeighbors> local_200;
  ON_SimpleArray<unsigned_int> local_1e8;
  ON_MeshNgon *local_1d0;
  ON_3dVector local_1c8;
  double local_1b0;
  double local_1a8;
  uint local_1a0;
  uint local_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  ON_3dVector local_180;
  uint **local_168;
  ulong local_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  _func_int **local_128;
  ON_MeshFaceList *local_120;
  ON_PlaneEquation local_118;
  double local_f8;
  double dStack_f0;
  double local_e8;
  double local_e0;
  double dStack_d8;
  double local_d0;
  ON_Plane local_c8;
  ON_MeshVertexFaceMap local_48;
  
  local_270 = (uint)CONCAT71(in_register_00000089,bAllowHoles);
  uVar2 = Ngons->m_count;
  uVar25 = vertex_list->m_point_count;
  uVar3 = face_list->m_face_count;
  new_capacity = (ulong)uVar3;
  bVar1 = face_list->m_bQuadFaces;
  local_274 = minimum_ngon_vertex_count;
  local_19c = minimum_ngon_face_count;
  ON_MeshVertexFaceMap::ON_MeshVertexFaceMap(&local_48);
  local_1e8._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c860;
  local_1e8.m_a = (uint *)0x0;
  local_1e8.m_count = 0;
  local_1e8.m_capacity = 0;
  local_128 = (_func_int **)&PTR__ON_SimpleArray_0081c860;
  local_2b0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c860;
  local_2b0.m_a = (uint *)0x0;
  local_2b0.m_count = 0;
  local_2b0.m_capacity = 0;
  local_200._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00823f00;
  local_200.m_a = (NgonNeighbors *)0x0;
  local_200.m_count = 0;
  local_200.m_capacity = 0;
  ON_PlaneEquation::ON_PlaneEquation(&local_118);
  if ((uVar3 == 0 || uVar3 != NgonMap->m_count) && (-1 < NgonMap->m_capacity)) {
    NgonMap->m_count = 0;
  }
  if ((uVar25 != 0 && uVar3 != 0) &&
     ((vertex_face_map != (uint **)0x0 ||
      (bVar7 = ON_MeshVertexFaceMap::SetFromFaceList(&local_48,uVar25,face_list,false),
      vertex_face_map = local_48.m_vertex_face_map,
      local_48.m_vertex_face_map != (uint **)0x0 && bVar7)))) {
    if ((uint)local_1e8.m_capacity < 0x80) {
      ON_SimpleArray<unsigned_int>::SetCapacity(&local_1e8,0x80);
    }
    if ((uint)local_2b0.m_capacity < 0x80) {
      ON_SimpleArray<unsigned_int>::SetCapacity(&local_2b0,0x80);
    }
    if ((uint)local_200.m_capacity < 0x80) {
      ON_SimpleArray<NgonNeighbors>::SetCapacity(&local_200,0x80);
    }
    if (uVar3 == NgonMap->m_count) {
      local_2f8 = NgonMap->m_a;
    }
    else {
      if ((ulong)(long)NgonMap->m_capacity < new_capacity) {
        ON_SimpleArray<unsigned_int>::SetCapacity(NgonMap,new_capacity);
      }
      if ((-1 < (int)uVar3) && ((int)uVar3 <= NgonMap->m_capacity)) {
        NgonMap->m_count = uVar3;
      }
      local_2f8 = NgonMap->m_a;
      if (uVar3 != 0) {
        memset(local_2f8,0xff,new_capacity * 4);
      }
    }
    local_220 = 0;
    if (uVar3 == 0) {
      bVar12 = 0;
    }
    else {
      lVar24 = (ulong)bVar1 * 4 + 8;
      lVar22 = (ulong)bVar1 + 3;
      local_1a0 = local_270 & 0xff | 0xfffffffe;
      uVar15 = 0;
      bVar12 = 0;
      local_120 = face_list;
      local_210 = lVar22;
      local_218 = lVar24;
      local_2ec = uVar2;
      do {
        local_160 = uVar15;
        if (local_2f8[uVar15] == 0xffffffff) {
          if (uVar15 < face_list->m_face_count) {
            puVar8 = face_list->m_faces;
            uVar15 = (ulong)(face_list->m_face_stride * (int)uVar15);
            local_268[5] = puVar8[uVar15 + 1];
            local_268[4] = puVar8[uVar15];
            local_268[7] = puVar8[uVar15 + 2];
            if (face_list->m_bQuadFaces == true) {
              local_268[7] = puVar8[uVar15 + 3];
            }
            local_268[6] = puVar8[uVar15 + 2];
          }
          else {
            local_268[4] = 0;
            local_268[5] = 0;
            local_268[6] = 0;
            local_268[7] = 0;
          }
          if (((local_268[4] != local_268[5]) && (local_268[5] != local_268[6])) &&
             (local_268[4] != *(int *)((long)local_268 + lVar24 + 0x10))) {
            uVar25 = vertex_list->m_point_count;
            pdVar10 = vertex_list->m_dP;
            uVar18 = vertex_list->m_point_stride;
            pfVar5 = vertex_list->m_fP;
            pOVar19 = &local_c8;
            lVar21 = 0;
            do {
              if (uVar25 <= local_268[lVar21 + 4]) goto LAB_005300f8;
              uVar15 = (ulong)(local_268[lVar21 + 4] * uVar18);
              if (pdVar10 == (double *)0x0) {
                (pOVar19->origin).x = (double)pfVar5[uVar15];
                (pOVar19->origin).y = (double)pfVar5[uVar15 + 1];
                dVar26 = (double)pfVar5[uVar15 + 2];
              }
              else {
                (pOVar19->origin).x = pdVar10[uVar15];
                (pOVar19->origin).y = pdVar10[uVar15 + 1];
                dVar26 = pdVar10[uVar15 + 2];
              }
              dVar16 = local_c8.origin.y;
              (pOVar19->origin).z = dVar26;
              dVar26 = local_c8.origin.z;
              lVar21 = lVar21 + 1;
              pOVar19 = (ON_Plane *)&pOVar19->xaxis;
            } while (lVar22 != lVar21);
            if (bVar1 == false) {
              local_c8.zaxis.z = local_c8.yaxis.z;
              local_c8.zaxis.x = local_c8.yaxis.x;
              local_c8.zaxis.y = local_c8.yaxis.y;
            }
            local_1a8 = local_c8.yaxis.x;
            local_290 = (_func_int **)local_c8.origin.x;
            local_1b0 = local_c8.yaxis.y;
            local_138 = local_c8.yaxis.z;
            uStack_130 = 0;
            ON_3dVector::ON_3dVector
                      ((ON_3dVector *)local_248,local_c8.yaxis.x - local_c8.origin.x,
                       local_c8.yaxis.y - local_c8.origin.y,local_c8.yaxis.z - local_c8.origin.z);
            uVar15 = local_160;
            local_280 = local_c8.zaxis.x;
            local_298 = local_c8.xaxis.x;
            local_288 = local_c8.zaxis.y;
            local_208 = (uint *)local_c8.xaxis.y;
            local_148 = local_c8.zaxis.z;
            uStack_140 = 0;
            local_158 = local_c8.xaxis.z;
            uStack_150 = 0;
            ON_3dVector::ON_3dVector
                      (&local_180,local_c8.zaxis.x - local_c8.xaxis.x,
                       local_c8.zaxis.y - local_c8.xaxis.y,local_c8.zaxis.z - local_c8.xaxis.z);
            ON_3dVector::ON_3dVector
                      (&local_1c8,
                       (double)local_248._8_8_ * local_180.z - (double)local_238 * local_180.y,
                       (double)local_238 * local_180.x - local_180.z * (double)local_248._0_8_,
                       (double)local_248._0_8_ * local_180.y - (double)local_248._8_8_ * local_180.x
                      );
            dVar17 = ON_3dVector::Length(&local_1c8);
            lVar24 = local_218;
            lVar22 = local_210;
            if (0.0 < dVar17) {
              local_1c8.x = local_1c8.x / dVar17;
              local_1c8.y = local_1c8.y / dVar17;
              local_1c8.z = local_1c8.z / dVar17;
              dVar26 = dVar26 * local_1c8.z + (double)local_290 * local_1c8.x + dVar16 * local_1c8.y
              ;
              if (((ABS((local_158 * local_1c8.z +
                        local_298 * local_1c8.x + (double)local_208 * local_1c8.y) - dVar26) <=
                    planar_tolerance) &&
                  (ABS((local_138 * local_1c8.z + local_1a8 * local_1c8.x + local_1b0 * local_1c8.y)
                       - dVar26) <= planar_tolerance)) &&
                 (ABS((local_148 * local_1c8.z + local_280 * local_1c8.x + local_288 * local_1c8.y)
                      - dVar26) <= planar_tolerance)) {
                dStack_230 = -dVar26;
                local_1d0 = (ON_MeshNgon *)0x0;
                local_2b4 = (uint)uVar15;
                if (-1 < (long)local_2b0._16_8_) {
                  local_2b0._16_8_ = local_2b0._16_8_ & 0xffffffff00000000;
                }
                local_288 = (double)CONCAT44(local_288._4_4_,vertex_list->m_point_count);
                local_248._0_8_ = local_1c8.x;
                local_248._8_8_ = local_1c8.y;
                local_238 = (_func_int **)local_1c8.z;
                local_118.x = local_1c8.x;
                local_118.y = local_1c8.y;
                local_118.z = local_1c8.z;
                local_118.d = dStack_230;
                ON_SimpleArray<unsigned_int>::Append(&local_2b0,&local_2b4);
                if (-1 < (long)local_200._16_8_) {
                  local_200._16_8_ = local_200._16_8_ & 0xffffffff00000000;
                }
                ON_SimpleArray<NgonNeighbors>::AppendNew(&local_200);
                local_2f8[local_2b4] = local_2ec;
                uVar25 = 0;
                if (local_2b0.m_count != 0) {
                  local_168 = vertex_face_map;
                  uVar13 = local_288._0_4_;
                  uVar18 = 0;
                  uVar25 = 0;
LAB_005305f6:
                  local_138 = (double)CONCAT44(local_138._4_4_,local_2b0.m_count);
LAB_005305ff:
                  local_290 = (_func_int **)(ulong)uVar18;
                  uVar18 = local_2b0.m_a[(long)local_290];
                  if (uVar18 < face_list->m_face_count) {
                    puVar8 = face_list->m_faces;
                    uVar15 = (ulong)(face_list->m_face_stride * uVar18);
                    local_198 = CONCAT44(puVar8[uVar15 + 1],puVar8[uVar15]);
                    uVar14 = puVar8[uVar15 + 2];
                    if (face_list->m_bQuadFaces == true) {
                      uVar14 = puVar8[uVar15 + 3];
                    }
                    uStack_190 = CONCAT44(uVar14,puVar8[uVar15 + 2]);
                  }
                  else {
                    local_198 = 0;
                    uStack_190 = 0;
                  }
                  if (uVar13 < (uint)local_198) {
                    puVar8 = (uint *)0x0;
                  }
                  else {
                    puVar8 = vertex_face_map[local_198 & 0xffffffff];
                  }
                  if (puVar8 == (uint *)0x0) {
                    local_2e8 = (uint *)0x0;
                  }
                  else {
                    local_2e8 = (uint *)0x0;
                    if (1 < *puVar8) {
                      local_2e8 = puVar8;
                    }
                  }
                  dVar26 = (double)((long)local_290 * 8 + 4);
                  uVar15 = local_198 & 0xffffffff;
                  dVar16 = 0.0;
LAB_005306a8:
                  dVar17 = (double)((long)dVar16 + 1);
                  uVar14 = *(uint *)((long)&local_198 + (ulong)(SUB84(dVar17,0) & 3) * 4);
                  puVar8 = local_2e8;
                  uVar6 = uVar25;
                  if ((uint)uVar15 != uVar14) {
                    if (uVar13 < uVar14) {
                      puVar8 = (uint *)0x0;
                    }
                    else {
                      puVar8 = vertex_face_map[uVar14];
                    }
                    uVar20 = uVar25 + 1;
                    uVar6 = uVar20;
                    if ((puVar8 == (uint *)0x0) || (*puVar8 < 2)) {
                      local_2e8 = (uint *)0x0;
                      puVar8 = local_2e8;
                    }
                    else if ((local_2e8 != (uint *)0x0) &&
                            (uVar6 = uVar25, local_200.m_a[(long)local_290].m_NFS[(long)dVar16] == 0
                            )) {
                      local_1a8 = (double)((long)local_290 * 0x20);
                      local_298 = (double)CONCAT44(local_298._4_4_,uVar20);
                      uVar6 = uVar20;
                      if (*local_2e8 != 0) {
                        local_208 = puVar8;
                        local_158 = dVar26;
                        local_148 = dVar16;
                        local_1b0 = (double)((long)dVar26 + (long)dVar16);
                        uVar23 = 1;
LAB_00530771:
                        local_26c = local_2e8[uVar23];
                        if (((uVar18 != local_26c) && (local_2b4 < local_26c)) &&
                           (local_2f8[local_26c] == 0xffffffff || local_2f8[local_26c] == local_2ec)
                           ) {
                          if (local_26c < face_list->m_face_count) {
                            puVar8 = face_list->m_faces;
                            uVar9 = (ulong)(local_26c * face_list->m_face_stride);
                            local_268[1] = puVar8[uVar9 + 1];
                            local_268[0] = puVar8[uVar9];
                            local_268[3] = puVar8[uVar9 + 2];
                            if (face_list->m_bQuadFaces == true) {
                              local_268[3] = puVar8[uVar9 + 3];
                            }
                            local_268[2] = puVar8[uVar9 + 2];
                          }
                          else {
                            local_268[0] = 0;
                            local_268[1] = 0;
                            local_268[2] = 0;
                            local_268[3] = 0;
                          }
                          lVar22 = 0;
                          lVar24 = 0;
                          do {
                            if ((uVar14 == local_268[lVar24]) &&
                               ((uint)uVar15 == local_268[(int)lVar24 + 1U & 3])) {
                              local_c8.origin.z = (double)local_238;
                              local_c8.xaxis.x = dStack_230;
                              local_c8.origin.x = (double)local_248._0_8_;
                              local_c8.origin.y = (double)local_248._8_8_;
                              local_180.x = -1.23432101234321e+308;
                              local_180.y = local_180.x;
                              local_180.z = local_180.x;
                              if (local_268[0] < vertex_list->m_point_count) {
                                pdVar10 = vertex_list->m_dP;
                                if (pdVar10 == (double *)0x0) {
                                  pfVar5 = vertex_list->m_fP;
                                  uVar9 = (ulong)(local_268[0] * vertex_list->m_point_stride);
                                  local_180.x = (double)pfVar5[uVar9];
                                  local_180.y = (double)pfVar5[uVar9 + 1];
                                  local_180.z = (double)pfVar5[uVar9 + 2];
                                }
                                else {
                                  uVar9 = (ulong)(local_268[0] * vertex_list->m_point_stride);
                                  local_180.x = pdVar10[uVar9];
                                  local_180.y = pdVar10[uVar9 + 1];
                                  local_180.z = pdVar10[uVar9 + 2];
                                }
                              }
                              P.y = local_180.y;
                              P.x = local_180.x;
                              P.z = local_180.z;
                              dVar26 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)&local_c8,P);
                              if (planar_tolerance < ABS(dVar26)) goto LAB_00530aae;
                              local_1c8.x = -1.23432101234321e+308;
                              local_1c8.y = local_1c8.x;
                              local_1c8.z = local_1c8.x;
                              if (local_268[1] < vertex_list->m_point_count) {
                                pdVar10 = vertex_list->m_dP;
                                if (pdVar10 == (double *)0x0) {
                                  pfVar5 = vertex_list->m_fP;
                                  uVar9 = (ulong)(local_268[1] * vertex_list->m_point_stride);
                                  local_1c8.x = (double)pfVar5[uVar9];
                                  local_1c8.y = (double)pfVar5[uVar9 + 1];
                                  local_1c8.z = (double)pfVar5[uVar9 + 2];
                                }
                                else {
                                  uVar9 = (ulong)(local_268[1] * vertex_list->m_point_stride);
                                  local_1c8.x = pdVar10[uVar9];
                                  local_1c8.y = pdVar10[uVar9 + 1];
                                  local_1c8.z = pdVar10[uVar9 + 2];
                                }
                              }
                              P_00.y = local_1c8.y;
                              P_00.x = local_1c8.x;
                              P_00.z = local_1c8.z;
                              dVar26 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)&local_c8,P_00)
                              ;
                              if (planar_tolerance < ABS(dVar26)) goto LAB_00530aae;
                              local_e0 = -1.23432101234321e+308;
                              dStack_d8 = local_e0;
                              local_d0 = local_e0;
                              if (local_268[2] < vertex_list->m_point_count) {
                                pdVar10 = vertex_list->m_dP;
                                if (pdVar10 == (double *)0x0) {
                                  pfVar5 = vertex_list->m_fP;
                                  uVar9 = (ulong)(vertex_list->m_point_stride * local_268[2]);
                                  local_e0 = (double)pfVar5[uVar9];
                                  dStack_d8 = (double)pfVar5[uVar9 + 1];
                                  local_d0 = (double)pfVar5[uVar9 + 2];
                                }
                                else {
                                  uVar9 = (ulong)(vertex_list->m_point_stride * local_268[2]);
                                  local_e0 = pdVar10[uVar9];
                                  dStack_d8 = pdVar10[uVar9 + 1];
                                  local_d0 = pdVar10[uVar9 + 2];
                                }
                              }
                              local_280 = (double)CONCAT44(local_280._4_4_,local_268[2]);
                              P_01.y = dStack_d8;
                              P_01.x = local_e0;
                              P_01.z = local_d0;
                              dVar26 = ON_PlaneEquation::ValueAt((ON_PlaneEquation *)&local_c8,P_01)
                              ;
                              if (planar_tolerance < ABS(dVar26)) goto LAB_00530aae;
                              if (local_268[3] != local_280._0_4_) {
                                local_f8 = -1.23432101234321e+308;
                                dStack_f0 = local_f8;
                                local_e8 = local_f8;
                                if (local_268[3] < vertex_list->m_point_count) {
                                  pdVar10 = vertex_list->m_dP;
                                  if (pdVar10 == (double *)0x0) {
                                    pfVar5 = vertex_list->m_fP;
                                    uVar9 = (ulong)(local_268[3] * vertex_list->m_point_stride);
                                    local_f8 = (double)pfVar5[uVar9];
                                    dStack_f0 = (double)pfVar5[uVar9 + 1];
                                    local_e8 = (double)pfVar5[uVar9 + 2];
                                  }
                                  else {
                                    uVar9 = (ulong)(local_268[3] * vertex_list->m_point_stride);
                                    local_f8 = pdVar10[uVar9];
                                    dStack_f0 = pdVar10[uVar9 + 1];
                                    local_e8 = pdVar10[uVar9 + 2];
                                  }
                                }
                                P_02.y = dStack_f0;
                                P_02.x = local_f8;
                                P_02.z = local_e8;
                                dVar26 = ON_PlaneEquation::ValueAt
                                                   ((ON_PlaneEquation *)&local_c8,P_02);
                                if (planar_tolerance < ABS(dVar26)) goto LAB_00530aae;
                              }
                              uVar25 = local_2b0.m_count;
                              if (local_2f8[local_26c] != 0xffffffff) goto LAB_00530bbb;
                              local_280 = (double)CONCAT44(local_280._4_4_,local_2b0.m_count);
                              local_2f8[local_26c] = local_2ec;
                              ON_SimpleArray<unsigned_int>::Append(&local_2b0,&local_26c);
                              pNVar11 = ON_SimpleArray<NgonNeighbors>::AppendNew(&local_200);
                              pdVar10 = (double *)((long)pNVar11 - lVar22);
                              uVar25 = local_280._0_4_;
                              goto LAB_00530c29;
                            }
                            lVar24 = lVar24 + 1;
                            lVar22 = lVar22 + -8;
                          } while (lVar24 != 4);
                          lVar24 = 4;
                          goto LAB_00530aae;
                        }
                        goto LAB_00530ac0;
                      }
                    }
                  }
                  goto LAB_00530c97;
                }
LAB_00530d0f:
                uVar18 = 0xffffffff;
                if ((local_274 <= uVar25) && (local_19c <= (uint)local_2b0.m_count)) {
                  if (-1 < (long)local_1e8._16_8_) {
                    local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffff00000000;
                  }
                  uVar13 = (int)local_220 + 1;
                  local_220 = (ulong)uVar13;
                  uVar13 = GetNgonBoundarySegments
                                     (face_list,local_2b0.m_count,local_2b0.m_a,uVar13,local_200.m_a
                                      ,&local_1e8,(ON_SimpleArray<unsigned_int> *)0x0);
                  if ((uVar13 != 0) && (local_274 <= (uint)local_1e8.m_count)) {
                    uVar18 = 0xffffffff;
                    if ((uint)local_1e8.m_count < uVar25) {
                      uVar25 = *local_1e8.m_a;
                      local_248._0_8_ = (_func_int **)0xffe5f8bd9e331dd2;
                      local_248._8_8_ = local_248._0_8_;
                      local_238 = (_func_int **)local_248._0_8_;
                      if (uVar25 < vertex_list->m_point_count) {
                        pdVar10 = vertex_list->m_dP;
                        if (pdVar10 == (double *)0x0) {
                          pfVar5 = vertex_list->m_fP;
                          uVar15 = (ulong)(uVar25 * vertex_list->m_point_stride);
                          local_248._0_8_ = (undefined8)pfVar5[uVar15];
                          local_248._8_8_ = (undefined8)pfVar5[uVar15 + 1];
                          local_238 = (_func_int **)(double)pfVar5[uVar15 + 2];
                        }
                        else {
                          uVar15 = (ulong)(uVar25 * vertex_list->m_point_stride);
                          local_248._0_8_ = pdVar10[uVar15];
                          local_248._8_8_ = pdVar10[uVar15 + 1];
                          local_238 = (_func_int **)pdVar10[uVar15 + 2];
                        }
                      }
                      ON_PlaneEquation::UnitNormal(&local_180,&local_118);
                      ON_Plane::ON_Plane(&local_c8,(ON_3dPoint *)local_248,&local_180);
                      local_2e8 = (uint *)Internal_NgonBoundaryArea
                                                    (&local_c8,vertex_list,&local_1e8);
                      do {
                        local_248._0_8_ = local_128;
                        local_248._8_8_ = (_func_int **)0x0;
                        local_238 = (_func_int **)0x0;
                        uVar25 = (int)local_220 + 1;
                        local_220 = (ulong)uVar25;
                        uVar25 = GetNgonBoundarySegments
                                           (face_list,local_2b0.m_count,local_2b0.m_a,uVar25,
                                            local_200.m_a,(ON_SimpleArray<unsigned_int> *)local_248,
                                            (ON_SimpleArray<unsigned_int> *)0x0);
                        bVar7 = 2 < (uint)local_238;
                        if (bVar7 && uVar25 != 0) {
                          dVar26 = Internal_NgonBoundaryArea
                                             (&local_c8,vertex_list,
                                              (ON_SimpleArray<unsigned_int> *)local_248);
                          if ((double)local_2e8 < dVar26) {
                            ON_SimpleArray<unsigned_int>::operator=
                                      (&local_1e8,(ON_SimpleArray<unsigned_int> *)local_248);
                            local_2e8 = (uint *)dVar26;
                          }
                        }
                        ON_SimpleArray<unsigned_int>::~ON_SimpleArray
                                  ((ON_SimpleArray<unsigned_int> *)local_248);
                      } while (bVar7 && uVar25 != 0);
                      ON_Plane::~ON_Plane(&local_c8);
                      uVar18 = local_1a0;
                      if ((char)local_270 == '\0') {
                        bVar12 = 1;
                        goto LAB_00530fce;
                      }
                    }
                    local_1d0 = ON_MeshNgonAllocator::AllocateNgon
                                          (NgonAllocator,local_1e8.m_count,local_2b0.m_count);
                    if (local_1d0 != (ON_MeshNgon *)0x0) {
                      memcpy(local_1d0->m_vi,local_1e8.m_a,(ulong)local_1d0->m_Vcount << 2);
                      memcpy(local_1d0->m_fi,local_2b0.m_a,(ulong)local_1d0->m_Fcount << 2);
                    }
                  }
                }
LAB_00530fce:
                if (local_1d0 == (ON_MeshNgon *)0x0) {
                  lVar24 = local_218;
                  lVar22 = local_210;
                  if ((local_2b0._16_8_ & 0xffffffff) != 0) {
                    uVar15 = 0;
                    do {
                      if (local_2f8[(int)local_2b0.m_a[uVar15]] == local_2ec) {
                        local_2f8[(int)local_2b0.m_a[uVar15]] = uVar18;
                      }
                      uVar15 = uVar15 + 1;
                    } while ((local_2b0._16_8_ & 0xffffffff) != uVar15);
                  }
                }
                else {
                  ON_SimpleArray<ON_MeshNgon_*>::Append(Ngons,&local_1d0);
                  local_2ec = local_2ec + 1;
                  lVar24 = local_218;
                  lVar22 = local_210;
                }
              }
            }
          }
        }
LAB_005300f8:
        uVar15 = local_160 + 1;
      } while (uVar15 != new_capacity);
    }
    if ((bool)(uVar3 != 0 & bVar12)) {
      uVar15 = 0;
      do {
        if (local_2f8[uVar15] == 0xfffffffe) {
          local_2f8[uVar15] = 0xffffffff;
        }
        uVar15 = uVar15 + 1;
      } while (new_capacity != uVar15);
    }
  }
  iVar4 = Ngons->m_count;
  ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray(&local_200);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_2b0);
  ON_SimpleArray<unsigned_int>::~ON_SimpleArray(&local_1e8);
  ON_MeshVertexFaceMap::~ON_MeshVertexFaceMap(&local_48);
  return iVar4 - uVar2;
  while (uVar9 = (ulong)uVar25, local_26c != local_2b0.m_a[uVar9]) {
LAB_00530bbb:
    uVar25 = uVar25 - 1;
    if (uVar25 <= (uint)local_290) goto LAB_00530aae;
  }
  if (local_200.m_a[uVar9].m_NFS[lVar24] == 0) {
    pdVar10 = (double *)((long)local_200.m_a + (uVar9 * 0x20 - lVar22));
LAB_00530c29:
    *pdVar10 = local_1b0;
    if ((uint)local_290 < uVar25) {
      *(ulong *)((long)(local_200.m_a)->m_NFS + (long)local_148 * 8 + (long)local_1a8) =
           (ulong)uVar25 * 8 + 4 + lVar24;
      local_298 = (double)CONCAT44(local_298._4_4_,local_298._0_4_ + -1);
      lVar24 = 5;
    }
  }
LAB_00530aae:
  face_list = local_120;
  if (lVar24 == 5) goto LAB_00530ca3;
LAB_00530ac0:
  uVar25 = (int)uVar23 + 1;
  uVar23 = (ulong)uVar25;
  if (*local_2e8 < uVar25) goto LAB_00530ca3;
  goto LAB_00530771;
LAB_00530ca3:
  dVar26 = local_158;
  vertex_face_map = local_168;
  uVar13 = local_288._0_4_;
  puVar8 = local_208;
  uVar6 = local_298._0_4_;
LAB_00530c97:
  uVar25 = uVar6;
  local_2e8 = puVar8;
  uVar15 = (ulong)uVar14;
  dVar16 = dVar17;
  if (dVar17 == 1.97626258336499e-323) goto LAB_00530cdf;
  goto LAB_005306a8;
LAB_00530cdf:
  uVar18 = (int)local_290 + 1;
  if (local_138._0_4_ <= uVar18) goto code_r0x00530d00;
  goto LAB_005305ff;
code_r0x00530d00:
  uVar18 = local_138._0_4_;
  if ((uint)local_2b0.m_count <= local_138._0_4_) goto LAB_00530d0f;
  goto LAB_005305f6;
}

Assistant:

unsigned int ON_MeshNgon::FindPlanarNgons(
  const ON_3dPointListRef& vertex_list,
  const ON_MeshFaceList& face_list,
  const unsigned int *const* vertex_face_map,
  double planar_tolerance,
  unsigned int minimum_ngon_vertex_count,
  unsigned int minimum_ngon_face_count,
  bool bAllowHoles,
  ON_MeshNgonAllocator& NgonAllocator,
  ON_SimpleArray<unsigned int>& NgonMap,
  ON_SimpleArray<ON_MeshNgon*>& Ngons
  )
{
  const unsigned int NgonsCount0 = Ngons.UnsignedCount();
  const unsigned int vertex_count = vertex_list.PointCount();
  const unsigned int face_count = face_list.FaceCount();
  unsigned int ngon_boundary_index = 0;
  const bool bQuadFaces = (4 == face_list.FaceVertexCount());

  ON_MeshVertexFaceMap ws_vfmap;

  ON_MeshNgon* ngon;
  unsigned int Fvi[4];
  unsigned int face_index, ngon_boundary_edge_count;
  ON_SimpleArray<unsigned int> ngon_vi;
  ON_SimpleArray<unsigned int> ngon_fi;
  ON_SimpleArray<struct NgonNeighbors> ngon_nbr_map;
  ON_PlaneEquation e;

  bool bCleanUpNgonMap = false;

  for (;;)
  {
    if ( face_count <= 0 || face_count != NgonMap.UnsignedCount() )
      NgonMap.SetCount(0);

    if ( face_count <= 0 || vertex_count <= 0 )
      break;
   
    if ( 0 == vertex_face_map )
    {
      if ( !ws_vfmap.SetFromFaceList(vertex_count,face_list,false) )
        break;
      vertex_face_map = ws_vfmap.VertexFaceMap();
      if ( 0 == vertex_face_map )
        break;
    }

    ngon_vi.Reserve(128);
    ngon_fi.Reserve(128);
    ngon_nbr_map.Reserve(128);

    unsigned int* ngonMap = NgonMap.Array();
    if ( face_count != NgonMap.UnsignedCount() )
    {
      NgonMap.Reserve(face_count);
      NgonMap.SetCount(face_count);
      ngonMap = NgonMap.Array(); // in case a reallocation occurred.
      for ( face_index = 0; face_index < face_count; face_index++ )
        ngonMap[face_index] = ON_UNSET_UINT_INDEX;
    }

    int ngonIndex = NgonsCount0;
    unsigned int ngonUnsetIndex;
    const unsigned int omitted_face_mark = ON_UNSET_UINT_INDEX - 1;

    for ( face_index = 0; face_index < face_count; face_index++ )
    {
      if ( ON_UNSET_UINT_INDEX != ngonMap[face_index] )
        continue; // this face is not eligable for being in an n-gon

      face_list.QuadFvi(face_index,Fvi);
      if ( !GetFacePlaneEquation(vertex_list,bQuadFaces,Fvi,planar_tolerance,e) )
        continue; // degenerate face

      for (;;)
      {
        ngon = 0;
        ngonUnsetIndex = ON_UNSET_UINT_INDEX;

        // Note:
        //   ngon_boundary_count includes interior edges when the n-gon has holes
        ngon_boundary_edge_count = GetCoplanarConnectedFaces(
          vertex_list,
          face_list,
          ngonIndex, ngonMap, vertex_face_map,
          planar_tolerance, face_index, e, 
          ngon_fi,
          ngon_nbr_map
          );

        if ( ngon_boundary_edge_count < minimum_ngon_vertex_count )
          break;

        if ( ngon_fi.UnsignedCount() < minimum_ngon_face_count )
          break;

        ngon_boundary_index++;
        ngon_vi.SetCount(0);
        if ( !GetNgonBoundarySegments(face_list,
                            ngon_fi.UnsignedCount(),ngon_fi.Array(),
                            ngon_boundary_index,
                            ngon_nbr_map.Array(),
                            &ngon_vi,
                            0
                            ) 
           )
          break;

        if ( ngon_vi.UnsignedCount() < minimum_ngon_vertex_count )
          break;

        if ( ngon_vi.UnsignedCount() < ngon_boundary_edge_count )
        {
          // ngon has holes.
          // The boundary with the largest area is the outer boundary.
          const ON_Plane ngon_plane(vertex_list[ngon_vi[0]], e.UnitNormal());

          double ngon_vi_area = Internal_NgonBoundaryArea(ngon_plane, vertex_list, ngon_vi);

          for(;;)
          {
            ON_SimpleArray<unsigned int> ngon_vi1;
            ngon_boundary_index++;
            if ( !GetNgonBoundarySegments(face_list,
                                ngon_fi.UnsignedCount(),ngon_fi.Array(),
                                ngon_boundary_index,
                                ngon_nbr_map.Array(),
                                &ngon_vi1, 0) 
               )
              break;
            if ( ngon_vi1.UnsignedCount() < 3 )
              break;
            double ngon_vi1_area = Internal_NgonBoundaryArea(ngon_plane, vertex_list, ngon_vi1);
            if (ngon_vi1_area > ngon_vi_area)
            {
              ngon_vi_area = ngon_vi1_area;
              ngon_vi = ngon_vi1;
            }
          }

          if (false == bAllowHoles)
          {
            ngonUnsetIndex = omitted_face_mark;
            bCleanUpNgonMap = true;
            break;
          }
        }

        ngon = NgonAllocator.AllocateNgon(ngon_vi.UnsignedCount(),ngon_fi.UnsignedCount());
        if ( 0 == ngon )
          break;

        memcpy(ngon->m_vi,ngon_vi.Array(),ngon->m_Vcount*sizeof(ngon->m_vi[0]));
        memcpy(ngon->m_fi,ngon_fi.Array(),ngon->m_Fcount*sizeof(ngon->m_fi[0]));
        break; // finished new ngon
      }

      if (0 == ngon)
      {
        // undo any modifications that were made to ngonMap[]
        UnsetNgonMap(ngon_fi.Array(),ngon_fi.UnsignedCount(),ngonIndex,ngonUnsetIndex,ngonMap);
        continue;
      }

      // found a new ngon
      Ngons.Append(ngon);
      ngonIndex++;
    }
    if (bCleanUpNgonMap)
    {
      for (face_index = 0; face_index < face_count; face_index++)
      {
        if (omitted_face_mark == ngonMap[face_index])
          ngonMap[face_index] = ON_UNSET_UINT_INDEX;
      }
    }
    break;
  }



  return Ngons.UnsignedCount() - NgonsCount0;
}